

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void kratos::fix_verilog_ln(Generator *generator,uint32_t offset)

{
  uint32_t uVar1;
  bool bVar2;
  element_type *peVar3;
  unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
  *puVar4;
  reference ppVar5;
  Stmt *stmt;
  pair<kratos::Stmt_*const,_kratos::StmtNode> *iter;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
  *__range1_1;
  unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
  stmts;
  StatementGraph graph;
  undefined1 local_68 [8];
  shared_ptr<kratos::Var> var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_name;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *var_names;
  Generator *pGStack_10;
  uint32_t offset_local;
  Generator *generator_local;
  
  if ((generator->debug & 1U) != 0) {
    (generator->super_IRNode).verilog_ln = offset + (generator->super_IRNode).verilog_ln;
    var_names._4_4_ = offset;
    pGStack_10 = generator;
    Generator::get_all_var_names_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,generator);
    local_20 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
    var_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&var_name), bVar2) {
      var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      Generator::get_var((Generator *)local_68,(string *)pGStack_10);
      uVar1 = var_names._4_4_;
      peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
      (peVar3->super_IRNode).verilog_ln = uVar1 + (peVar3->super_IRNode).verilog_ln;
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_68);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    StatementGraph::StatementGraph((StatementGraph *)&stmts._M_h._M_single_bucket,pGStack_10);
    puVar4 = StatementGraph::nodes((StatementGraph *)&stmts._M_h._M_single_bucket);
    std::
    unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
    ::unordered_map((unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
                     *)&__range1_1,puVar4);
    __end1_1 = std::
               unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
               ::begin((unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
                        *)&__range1_1);
    iter = (pair<kratos::Stmt_*const,_kratos::StmtNode> *)
           std::
           unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
           ::end((unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
                  *)&__range1_1);
    while (bVar2 = std::__detail::operator!=
                             (&__end1_1.
                               super__Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false>
                              ,(_Node_iterator_base<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false>
                                *)&iter), bVar2) {
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false,_false>::
               operator*(&__end1_1);
      (ppVar5->first->super_IRNode).verilog_ln =
           var_names._4_4_ + (ppVar5->first->super_IRNode).verilog_ln;
      std::__detail::_Node_iterator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>,_false,_false>
      ::operator++(&__end1_1);
    }
    std::
    unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
    ::~unordered_map((unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
                      *)&__range1_1);
    StatementGraph::~StatementGraph((StatementGraph *)&stmts._M_h._M_single_bucket);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
  }
  return;
}

Assistant:

void fix_verilog_ln(Generator* generator, uint32_t offset) {
    // need to fix every variable and statement verilog line number by an offset
    if (!generator->debug) return;
    // fix the variable declaration
    generator->verilog_ln += offset;
    auto const& var_names = generator->get_all_var_names();
    for (auto const& var_name : var_names) {
        auto var = generator->get_var(var_name);
        var->verilog_ln += offset;
    }
    // get all the statement graph
    StatementGraph graph(generator);
    auto stmts = graph.nodes();
    for (auto const& iter : stmts) {
        auto* stmt = iter.first;
        stmt->verilog_ln += offset;
    }
}